

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libwebsockets.c
# Opt level: O2

char * lws_json_purify(char *escaped,char *string,int len,int *in_used)

{
  char cVar1;
  char *pcVar2;
  char *p;
  char *q;
  long lVar3;
  
  pcVar2 = escaped;
  if (string == (char *)0x0) {
    *escaped = '\0';
  }
  else {
    lVar3 = 0;
    while ((cVar1 = string[lVar3], cVar1 != '\0' && (6 < len))) {
      if (cVar1 == '\\') goto LAB_0010eb21;
      if (cVar1 == '\n') {
        escaped[0] = '\\';
        escaped[1] = 'n';
LAB_0010eb15:
        escaped = escaped + 2;
        len = len + -1;
      }
      else {
        if (cVar1 == '\r') {
          escaped[0] = '\\';
          escaped[1] = 'r';
          goto LAB_0010eb15;
        }
        if (cVar1 == '\"') {
LAB_0010eb21:
          escaped[0] = '\\';
          escaped[1] = 'u';
          escaped[2] = '0';
          escaped[3] = '0';
          escaped[4] = "0123456789ABCDEF"[(byte)string[lVar3] >> 4];
          escaped[5] = "0123456789ABCDEF"[(byte)string[lVar3] & 0xf];
          escaped = escaped + 6;
          len = len + -6;
        }
        else {
          if (cVar1 == '\t') {
            escaped[0] = '\\';
            escaped[1] = 't';
            goto LAB_0010eb15;
          }
          if (cVar1 < ' ') goto LAB_0010eb21;
          *escaped = cVar1;
          escaped = escaped + 1;
          len = len + -1;
        }
      }
      lVar3 = lVar3 + 1;
    }
    *escaped = '\0';
    if (in_used != (int *)0x0) {
      *in_used = (int)lVar3;
      return pcVar2;
    }
  }
  return pcVar2;
}

Assistant:

const char *
lws_json_purify(char *escaped, const char *string, int len, int *in_used)
{
	const char *p = string;
	char *q = escaped;

	if (!p) {
		escaped[0] = '\0';
		return escaped;
	}

	while (*p && len-- > 6) {
		if (*p == '\t') {
			p++;
			*q++ = '\\';
			*q++ = 't';
			continue;
		}

		if (*p == '\n') {
			p++;
			*q++ = '\\';
			*q++ = 'n';
			continue;
		}

		if (*p == '\r') {
			p++;
			*q++ = '\\';
			*q++ = 'r';
			continue;
		}

		if (*p == '\"' || *p == '\\' || *p < 0x20) {
			*q++ = '\\';
			*q++ = 'u';
			*q++ = '0';
			*q++ = '0';
			*q++ = hex[((*p) >> 4) & 15];
			*q++ = hex[(*p) & 15];
			len -= 5;
			p++;
		} else
			*q++ = *p++;
	}
	*q = '\0';

	if (in_used)
		*in_used = lws_ptr_diff(p, string);

	return escaped;
}